

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

liu * __thiscall liu::sigmoid(liu *this,Mat *x)

{
  Scalar_<double> local_358;
  Mat exp_x;
  long *local_2d8 [44];
  _InputArray local_178 [14];
  
  cv::Mat::Mat(&exp_x);
  cv::Mat::Mat((Mat *)this);
  cv::operator-((cv *)local_2d8,x);
  cv::_InputArray::_InputArray(local_178,(MatExpr *)local_2d8);
  local_358.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_358.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x2010000;
  local_358.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&exp_x;
  cv::exp(local_178,(_OutputArray *)&local_358);
  cv::MatExpr::~MatExpr((MatExpr *)local_2d8);
  cv::Scalar_<double>::Scalar_(&local_358,1.0);
  cv::operator+((Scalar_ *)local_178,(Mat *)&local_358);
  cv::operator/(1.0,(MatExpr *)local_2d8);
  (**(code **)(*local_2d8[0] + 0x18))(local_2d8[0],local_2d8,this,0xffffffffffffffff);
  cv::MatExpr::~MatExpr((MatExpr *)local_2d8);
  cv::MatExpr::~MatExpr((MatExpr *)local_178);
  cv::Mat::~Mat(&exp_x);
  return this;
}

Assistant:

cv::Mat sigmoid(cv::Mat &x)
	{
		cv::Mat exp_x, fx;
		cv::exp(-x, exp_x);
		fx = 1.0 / (1.0 + exp_x);
		return fx;
	}